

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O3

int bcf_sr_regions_overlap(bcf_sr_regions_t *reg,char *seq,int start,int end)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  char *pcVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  
  puVar3 = (uint *)reg->seq_hash;
  if (puVar3 != (uint *)0x0) {
    uVar1 = *puVar3;
    if (uVar1 == 0) {
      uVar12 = 0;
LAB_001154e9:
      if (uVar12 != uVar1) {
        iVar11 = *(int *)(*(long *)(puVar3 + 8) + (ulong)uVar12 * 4);
        iVar7 = reg->prev_seq;
        if (((iVar7 == -1) || (iVar11 != iVar7)) || (start < reg->prev_start)) {
          if (((iVar7 != -1) &&
              (reg->missed_reg_handler != (_func_void__bcf_sr_regions_t_ptr_void_ptr *)0x0)) &&
             (reg->iseq != -1)) {
            bcf_sr_regions_flush(reg);
          }
          bcf_sr_regions_seek(reg,seq);
          reg->start = -1;
          reg->end = -1;
          if (reg->prev_seq != iVar11) {
            reg->prev_seq = reg->iseq;
            reg->prev_start = start;
            iVar7 = reg->iseq;
            goto joined_r0x0011559a;
          }
        }
        if (reg->iseq != iVar11) {
          return -2;
        }
        reg->prev_seq = iVar11;
        reg->prev_start = start;
        do {
          if (start <= reg->end) break;
          iVar7 = bcf_sr_regions_next(reg);
          if (iVar7 < 0) {
            return -2;
          }
          if (reg->iseq != iVar11) {
            return -1;
          }
          iVar7 = iVar11;
          if ((reg->missed_reg_handler != (_func_void__bcf_sr_regions_t_ptr_void_ptr *)0x0) &&
             (reg->end < start)) {
            (*reg->missed_reg_handler)(reg,reg->missed_reg_data);
            iVar7 = reg->iseq;
          }
joined_r0x0011559a:
        } while (iVar11 == iVar7);
        return -(uint)(end < reg->start);
      }
    }
    else {
      uVar10 = (uint)*seq;
      if (*seq == '\0') {
        uVar10 = 0;
      }
      else {
        cVar5 = seq[1];
        if (cVar5 != '\0') {
          pcVar9 = seq + 2;
          do {
            uVar10 = (int)cVar5 + uVar10 * 0x1f;
            cVar5 = *pcVar9;
            pcVar9 = pcVar9 + 1;
          } while (cVar5 != '\0');
        }
      }
      uVar10 = uVar10 & uVar1 - 1;
      lVar4 = *(long *)(puVar3 + 4);
      iVar11 = 1;
      uVar12 = uVar10;
      do {
        uVar2 = *(uint *)(lVar4 + (ulong)(uVar12 >> 4) * 4);
        bVar8 = (char)uVar12 * '\x02' & 0x1e;
        uVar6 = uVar2 >> bVar8;
        if (((uVar6 & 2) != 0) ||
           (((uVar6 & 1) == 0 &&
            (iVar7 = strcmp(*(char **)(*(long *)(puVar3 + 6) + (ulong)uVar12 * 8),seq), iVar7 == 0))
           )) {
          if ((uVar2 >> bVar8 & 3) != 0) {
            uVar12 = uVar1;
          }
          goto LAB_001154e9;
        }
        uVar12 = uVar12 + iVar11 & uVar1 - 1;
        iVar11 = iVar11 + 1;
      } while (uVar12 != uVar10);
    }
  }
  return -1;
}

Assistant:

int bcf_sr_regions_overlap(bcf_sr_regions_t *reg, const char *seq, int start, int end)
{
    int iseq;
    if ( khash_str2int_get(reg->seq_hash, seq, &iseq)<0 ) return -1;    // no such sequence

    if ( reg->prev_seq==-1 || iseq!=reg->prev_seq || reg->prev_start > start ) // new chromosome or after a seek
    {
        // flush regions left on previous chromosome
        if ( reg->missed_reg_handler && reg->prev_seq!=-1 && reg->iseq!=-1 )
            bcf_sr_regions_flush(reg);

        bcf_sr_regions_seek(reg, seq);
        reg->start = reg->end = -1;
    }
    if ( reg->prev_seq==iseq && reg->iseq!=iseq ) return -2;    // no more regions on this chromosome
    reg->prev_seq = reg->iseq;
    reg->prev_start = start;

    while ( iseq==reg->iseq && reg->end < start )
    {
        if ( bcf_sr_regions_next(reg) < 0 ) return -2;  // no more regions left
        if ( reg->iseq != iseq ) return -1; // does not overlap any regions
        if ( reg->missed_reg_handler && reg->end < start ) reg->missed_reg_handler(reg, reg->missed_reg_data);
    }
    if ( reg->start <= end ) return 0;    // region overlap
    return -1;  // no overlap
}